

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_SubDLevel_*>::Append(ON_SimpleArray<ON_SubDLevel_*> *this,ON_SubDLevel **x)

{
  int iVar1;
  ON_SubDLevel *pOVar2;
  uint uVar3;
  ON_SubDLevel **memblock;
  long lVar4;
  uint uVar5;
  
  uVar3 = this->m_count;
  lVar4 = (long)(int)uVar3;
  if (uVar3 == this->m_capacity) {
    if ((int)uVar3 < 8 || (ulong)(lVar4 * 8) < 0x10000001) {
      uVar5 = 4;
      if (2 < (int)uVar3) {
        uVar5 = uVar3 * 2;
      }
    }
    else {
      uVar5 = 0x2000008;
      if (uVar3 < 0x2000008) {
        uVar5 = uVar3;
      }
      uVar5 = uVar5 + uVar3;
    }
    memblock = x;
    if (x < this->m_a + lVar4 && this->m_a <= x) {
      memblock = (ON_SubDLevel **)onmalloc(8);
      *memblock = *x;
      uVar3 = this->m_capacity;
    }
    if (uVar3 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    if (this->m_a == (ON_SubDLevel **)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar1 = this->m_count;
    pOVar2 = *memblock;
    this->m_count = iVar1 + 1;
    this->m_a[iVar1] = pOVar2;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  else {
    pOVar2 = *x;
    this->m_count = uVar3 + 1;
    this->m_a[lVar4] = pOVar2;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}